

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_any(TT_Face face,FT_ULong tag,FT_Long offset,FT_Byte *buffer,FT_ULong *length)

{
  FT_Error FVar1;
  TT_Table pTVar2;
  FT_ULong local_58;
  FT_ULong size;
  TT_Table table;
  FT_Stream stream;
  FT_Error error;
  FT_ULong *length_local;
  FT_Byte *buffer_local;
  FT_Long offset_local;
  FT_ULong tag_local;
  TT_Face face_local;
  
  if (tag == 0) {
    local_58 = ((face->root).stream)->size;
    buffer_local = (FT_Byte *)offset;
  }
  else {
    pTVar2 = tt_face_lookup_table(face,tag);
    if (pTVar2 == (TT_Table)0x0) {
      return 0x8e;
    }
    buffer_local = (FT_Byte *)(pTVar2->Offset + offset);
    local_58 = pTVar2->Length;
  }
  if ((length != (FT_ULong *)0x0) && (*length == 0)) {
    *length = local_58;
    return 0;
  }
  if (length != (FT_ULong *)0x0) {
    local_58 = *length;
  }
  FVar1 = FT_Stream_ReadAt((face->root).stream,(FT_ULong)buffer_local,buffer,local_58);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_any( TT_Face    face,
                    FT_ULong   tag,
                    FT_Long    offset,
                    FT_Byte*   buffer,
                    FT_ULong*  length )
  {
    FT_Error   error;
    FT_Stream  stream;
    TT_Table   table;
    FT_ULong   size;


    if ( tag != 0 )
    {
      /* look for tag in font directory */
      table = tt_face_lookup_table( face, tag );
      if ( !table )
      {
        error = FT_THROW( Table_Missing );
        goto Exit;
      }

      offset += table->Offset;
      size    = table->Length;
    }
    else
      /* tag == 0 -- the user wants to access the font file directly */
      size = face->root.stream->size;

    if ( length && *length == 0 )
    {
      *length = size;

      return FT_Err_Ok;
    }

    if ( length )
      size = *length;

    stream = face->root.stream;
    /* the `if' is syntactic sugar for picky compilers */
    if ( FT_STREAM_READ_AT( offset, buffer, size ) )
      goto Exit;

  Exit:
    return error;
  }